

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_fp16.h
# Opt level: O0

void ncnn::cast_fp32_to_fp16_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  unsigned_short uVar2;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar3 [16];
  __m128i _v_fp16_1;
  __m128 _v_fp32_1;
  __m128i _v_fp16;
  __m256 _v_fp32;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_330;
  undefined8 uStack_328;
  int local_2f4;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined1 (*local_2a8) [16];
  undefined8 local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined4 local_278;
  long local_270;
  undefined4 local_268;
  undefined4 local_264;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined8 local_250;
  undefined1 (*local_248) [32];
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  long *local_218;
  long *local_210;
  undefined1 local_205;
  int local_204;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e0;
  undefined8 *local_1d0;
  undefined1 local_1bd;
  int local_1bc;
  undefined8 *local_1b0;
  undefined8 *local_1a0;
  undefined1 (*local_198) [32];
  undefined8 local_190;
  undefined8 uStack_188;
  undefined1 (*local_180) [16];
  undefined1 (*local_178) [32];
  undefined1 local_170 [16];
  undefined1 (*local_158) [16];
  long local_150;
  undefined4 local_144;
  long local_140;
  undefined1 (*local_138) [16];
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined1 (*local_100) [32];
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined8 *local_98;
  undefined8 *local_78;
  
  local_224 = *(int *)((long)in_RDI + 0x2c);
  local_228 = (int)in_RDI[6];
  local_22c = *(int *)((long)in_RDI + 0x34);
  local_230 = (int)in_RDI[7];
  local_234 = (int)in_RDI[3];
  local_238 = local_224 * local_228 * local_22c * local_234;
  local_218 = in_RSI;
  local_210 = in_RDI;
  for (local_23c = 0; local_23c < local_230; local_23c = local_23c + 1) {
    local_1f8 = &local_290;
    local_ec = *(int *)((long)local_210 + 0x2c);
    local_f0 = (int)local_210[6];
    local_f4 = *(undefined4 *)((long)local_210 + 0x34);
    local_100 = (undefined1 (*) [32])(*local_210 + local_210[8] * (long)local_23c * local_210[2]);
    local_108 = local_210[2];
    local_10c = (undefined4)local_210[3];
    local_118 = local_210[4];
    local_e8 = &local_290;
    local_d8 = (long)local_ec * (long)local_f0 * local_108;
    local_1f0 = &local_290;
    local_1e0 = &local_290;
    local_1b0 = &local_2f0;
    local_124 = *(int *)((long)local_218 + 0x2c);
    local_128 = (int)local_218[6];
    local_12c = *(undefined4 *)((long)local_218 + 0x34);
    local_138 = (undefined1 (*) [16])(*local_218 + local_218[8] * (long)local_23c * local_218[2]);
    local_140 = local_218[2];
    local_144 = (undefined4)local_218[3];
    local_150 = local_218[4];
    local_120 = &local_2f0;
    local_c8 = (long)local_124 * (long)local_128 * local_140;
    local_1a0 = &local_2f0;
    local_1d0 = &local_2f0;
    local_258 = 0;
    local_25c = 0;
    local_260 = 0;
    local_264 = 0;
    local_278 = 0;
    local_280 = 0;
    local_288 = 0;
    local_290 = 0;
    local_cc = 0x10;
    local_dc = 0x10;
    local_1bc = local_23c;
    local_1bd = 1;
    local_204 = local_23c;
    local_205 = 1;
    local_250 = 0;
    local_268 = 0;
    local_2f0 = 0;
    local_2e0 = 0;
    local_2d8 = 0;
    local_2c8 = 0;
    local_2c4 = 0;
    local_2c0 = 0;
    local_2bc = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2e8 = 0;
    local_2a8 = local_138;
    local_248 = local_100;
    for (local_2f4 = 0; local_2f4 + 7 < local_238; local_2f4 = local_2f4 + 8) {
      local_198 = local_248;
      auVar3 = vcvtps2ph_f16c(*local_248,8);
      local_180 = local_2a8;
      local_330 = auVar3._0_8_;
      local_190 = local_330;
      uStack_328 = auVar3._8_8_;
      uStack_188 = uStack_328;
      *local_2a8 = auVar3;
      local_248 = local_248 + 1;
      local_2a8 = local_2a8 + 1;
    }
    for (; local_98 = local_1d0, local_78 = local_1e0, local_2d0 = local_150, local_270 = local_118,
        local_2f4 + 3 < local_238; local_2f4 = local_2f4 + 4) {
      local_178 = local_248;
      local_170 = vcvtps2ph_f16c(*(undefined1 (*) [16])*local_248,8);
      local_158 = local_2a8;
      *(undefined8 *)*local_2a8 = local_170._0_8_;
      local_248 = (undefined1 (*) [32])(*local_248 + 0x10);
      local_2a8 = (undefined1 (*) [16])(*local_2a8 + 8);
    }
    for (; local_2f4 < local_238; local_2f4 = local_2f4 + 1) {
      puVar1 = *local_248;
      local_248 = (undefined1 (*) [32])(*local_248 + 4);
      uVar2 = float32_to_float16(*(float *)puVar1);
      *(unsigned_short *)*local_2a8 = uVar2;
      local_2a8 = (undefined1 (*) [16])(*local_2a8 + 2);
    }
  }
  return;
}

Assistant:

static void cast_fp32_to_fp16_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        cast_fp32_to_fp16_sse_f16c(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        unsigned short* outptr = top_blob.channel(q);

        int i = 0;
#if __F16C__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v_fp32 = _mm512_loadu_ps(ptr);
            __m256i _v_fp16 = _mm512_cvtps_ph(_v_fp32, _MM_ROUND_NEAREST | _MM_FROUND_NO_EXC);
            _mm256_storeu_si256((__m256i*)outptr, _v_fp16);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v_fp32 = _mm256_loadu_ps(ptr);
            __m128i _v_fp16 = _mm256_cvtps_ph(_v_fp32, _MM_ROUND_NEAREST | _MM_FROUND_NO_EXC);
            _mm_storeu_si128((__m128i*)outptr, _v_fp16);
            ptr += 8;
            outptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128 _v_fp32 = _mm_loadu_ps(ptr);
            __m128i _v_fp16 = _mm_cvtps_ph(_v_fp32, _MM_ROUND_NEAREST | _MM_FROUND_NO_EXC);
            _mm_storel_epi64((__m128i*)outptr, _v_fp16);
            ptr += 4;
            outptr += 4;
        }
#endif // __F16C__
        for (; i < size; i++)
        {
            *outptr++ = float32_to_float16(*ptr++);
        }
    }
}